

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void P_CheckSplash(AActor *self,double distance)

{
  int iVar1;
  sector_t_conflict *psVar2;
  double dVar3;
  double dVar4;
  sector_t *floorsec;
  sector_t_conflict *local_38;
  double local_30;
  DVector3 local_28;
  
  local_28.X = (self->__Pos).X;
  local_28.Y = (self->__Pos).Y;
  local_30 = distance;
  sector_t::LowestFloorAt(self->Sector,(DVector2 *)&local_28,&local_38);
  if (((self->__Pos).Z <= local_30 + self->floorz) &&
     ((sector_t_conflict *)self->floorsector == local_38)) {
    psVar2 = sector_t::GetHeightSec((sector_t_conflict *)self->Sector);
    if ((psVar2 == (sector_t_conflict *)0x0) && (local_38->heightsec == (sector_t_conflict *)0x0)) {
      iVar1 = self->Sector->PortalGroup;
      dVar3 = 0.0;
      dVar4 = 0.0;
      if (iVar1 != local_38->PortalGroup) {
        dVar3 = Displacements.data.Array[local_38->PortalGroup * Displacements.size + iVar1].pos.X;
        dVar4 = Displacements.data.Array[local_38->PortalGroup * Displacements.size + iVar1].pos.Y;
      }
      dVar4 = (self->__Pos).Y + dVar4;
      local_28.Y._0_4_ = SUB84(dVar4,0);
      local_28.X = (self->__Pos).X + dVar3;
      local_28.Y._4_4_ = (int)((ulong)dVar4 >> 0x20);
      local_28.Z = self->floorz;
      P_HitWater(self,(sector_t *)local_38,&local_28,false,false,false);
    }
  }
  return;
}

Assistant:

void P_CheckSplash(AActor *self, double distance)
{
	sector_t *floorsec;
	self->Sector->LowestFloorAt(self, &floorsec);
	if (self->Z() <= self->floorz + distance && self->floorsector == floorsec && self->Sector->GetHeightSec() == NULL && floorsec->heightsec == NULL)
	{
		// Explosion splashes never alert monsters. This is because A_Explode has
		// a separate parameter for that so this would get in the way of proper 
		// behavior.
		DVector3 pos = self->PosRelative(floorsec);
		pos.Z = self->floorz;
		P_HitWater (self, floorsec, pos, false, false);
	}
}